

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateExtensionCode
          (WrapperFieldGenerator *this,Printer *printer)

{
  WritePropertyDocComment(printer,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddDeprecatedFlag(&this->super_FieldGeneratorBase,printer);
  google::protobuf::io::Printer::Print
            ((map *)printer,(char *)&(this->super_FieldGeneratorBase).variables_);
  (*(this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
            (this,printer);
  io::Printer::Print<>(printer,");\n");
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::Extension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::Extension<$extended_type$, $type_name$>($number$, ");
  GenerateCodecCode(printer);
  printer->Print(");\n");
}